

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT CreateRuntime(JsRuntimeHandle *runtime)

{
  int iVar1;
  JsErrorCode JVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  sysinfo sysInfo;
  size_t memoryLimit;
  HRESULT hr;
  JsRuntimeHandle *runtime_local;
  
  memoryLimit._4_4_ = -0x7fffbffb;
  iVar1 = sysinfo((sysinfo *)&jsErrorCode_1);
  if (iVar1 == -1) {
    sysInfo.mem_unit = 0;
    sysInfo._108_4_ = 0;
  }
  else {
    sysInfo._104_8_ = sysInfo.loads[2];
  }
  JVar2 = ChakraRTInterface::JsCreateRuntime(jsrtAttributes,(JsThreadServiceCallback)0x0,runtime);
  if (JVar2 == JsNoError) {
    JVar2 = ChakraRTInterface::JsSetRuntimeMemoryLimit(*runtime,sysInfo._104_8_);
    if (JVar2 == JsNoError) {
      memoryLimit._4_4_ = 0;
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar2);
      PAL_fwprintf(pPVar3,
                   L"ERROR: ChakraRTInterface::JsSetRuntimeMemoryLimit(*runtime, memoryLimit) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar2,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    pWVar4 = Helpers::JsErrorCodeToString(JVar2);
    PAL_fwprintf(pPVar3,
                 L"ERROR: ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, runtime) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar2,pWVar4);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
  }
  return memoryLimit._4_4_;
}

Assistant:

static HRESULT CreateRuntime(JsRuntimeHandle *runtime)
{
    HRESULT hr = E_FAIL;

#ifndef _WIN32
    // On Posix, malloc optimistically returns a non-null address without
    // checking if it's actually able to back that allocation in memory
    // Upon use of that address however, if the address space for that allocation
    // can't be committed, the process is killed
    // See the man page for malloc
    //
    // In order to avoid having to deal with this, we set the memory limit for the
    // runtime to the size of the physical memory on the system
    // TODO: 
    // We could move the following into its own platform agnostic API
    // but in this case, this is a one-time call thats not applicable
    // on Windows so decided to leave as is
    // Additionally, we can probably do better than just limit to the physical memory
    // size

#if defined(__APPLE__) || defined(__linux__)
    size_t memoryLimit;
#ifdef __APPLE__
    int totalRamHW[] = { CTL_HW, HW_MEMSIZE };
    size_t length = sizeof(memoryLimit);
    if (sysctl(totalRamHW, 2, &memoryLimit, &length, NULL, 0) == -1)
    {
        memoryLimit = 0;
    }
#else
    struct sysinfo sysInfo;
    if (sysinfo(&sysInfo) == -1)
    {
        memoryLimit = 0;
    }
    else
    {
        memoryLimit = sysInfo.totalram;
    }
#endif // __APPLE__
#endif // __APPLE__ || __linux
#endif // !_WIN32

    IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, runtime));

#ifndef _WIN32
    IfJsErrorFailLog(ChakraRTInterface::JsSetRuntimeMemoryLimit(*runtime, memoryLimit));
#endif

    hr = S_OK;
Error:
    return hr;
}